

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

int __thiscall luna::Lexer::LexId(Lexer *this,TokenDetail *detail)

{
  string *str;
  undefined8 *puVar1;
  char *__s2;
  char *__s1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  String *pSVar6;
  LexException *this_00;
  difference_type __d_1;
  ulong uVar7;
  undefined8 *puVar8;
  anon_union_16_2_eed97686_for_String_2 *module;
  ulong uVar9;
  difference_type __d;
  ulong uVar10;
  undefined8 *local_58;
  undefined8 *local_50;
  
  iVar5 = this->current_;
  iVar3 = isalpha(iVar5);
  if ((iVar5 != 0x5f) && (iVar3 == 0)) {
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar6 = this->module_;
    if ((pSVar6->super_GCObject).field_0x11 == '\0') {
      module = &pSVar6->field_1;
    }
    else {
      module = (anon_union_16_2_eed97686_for_String_2 *)(pSVar6->field_1).str_;
    }
    LexException::LexException<char_const(&)[19]>
              (this_00,module->str_buffer_,this->line_,this->column_,
               (char (*) [19])"unexpect character");
    __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
  }
  str = &this->token_buffer_;
  (this->token_buffer_)._M_string_length = 0;
  *(this->token_buffer_)._M_dataplus._M_p = '\0';
  do {
    do {
      std::__cxx11::string::push_back((char)str);
      uVar4 = Next(this);
      puVar8 = (undefined8 *)(ulong)uVar4;
      this->current_ = uVar4;
      iVar5 = isalnum(uVar4);
    } while (uVar4 == 0x5f);
  } while (iVar5 != 0);
  __s2 = (str->_M_dataplus)._M_p;
  local_58 = (undefined8 *)(anonymous_namespace)::keyword;
  uVar7 = 0x15;
  do {
    if ((long)uVar7 < 1) {
      local_50 = local_58;
      puVar8 = local_58;
      break;
    }
    uVar10 = uVar7 >> 1;
    puVar1 = local_58 + uVar10;
    __s1 = (char *)*puVar1;
    iVar5 = strcmp(__s1,__s2);
    if (iVar5 < 0) {
      local_58 = puVar1 + 1;
      bVar2 = true;
      uVar10 = uVar7 + ~uVar10;
    }
    else {
      iVar5 = strcmp(__s2,__s1);
      bVar2 = true;
      if (-1 < iVar5) {
        puVar8 = local_58;
        if (uVar7 != 1) {
          do {
            uVar9 = uVar10 >> 1;
            iVar5 = strcmp((char *)puVar8[uVar9],__s2);
            if (iVar5 < 0) {
              puVar8 = puVar8 + uVar9 + 1;
              uVar9 = ~uVar9 + uVar10;
            }
            uVar10 = uVar9;
          } while (0 < (long)uVar9);
        }
        local_58 = local_58 + uVar7;
        local_50 = puVar1 + 1;
        uVar10 = (long)local_58 - (long)local_50 >> 3;
        while (uVar9 = uVar10, 0 < (long)uVar9) {
          uVar10 = uVar9 >> 1;
          iVar5 = strcmp(__s2,(char *)local_50[uVar10]);
          if (-1 < iVar5) {
            local_50 = local_50 + uVar10 + 1;
            uVar10 = ~uVar10 + uVar9;
          }
        }
        bVar2 = false;
        uVar10 = uVar7;
      }
    }
    uVar7 = uVar10;
  } while (bVar2);
  iVar5 = 0x115;
  if (puVar8 != local_50) {
    iVar5 = (int)((ulong)(puVar8 + -0x31454) >> 3) + 0x100;
  }
  pSVar6 = State::GetString(this->state_,str);
  (detail->field_0).str_ = pSVar6;
  detail->token_ = iVar5;
  iVar3 = this->column_;
  detail->line_ = this->line_;
  detail->column_ = iVar3;
  detail->module_ = this->module_;
  return iVar5;
}

Assistant:

int Lexer::LexId(TokenDetail *detail)
    {
        if (!isalpha(current_) && current_ != '_')
            throw LexException(module_->GetCStr(),
                    line_, column_, "unexpect character");

        token_buffer_.clear();
        token_buffer_.push_back(current_);
        current_ = Next();

        while (isalnum(current_) || current_ == '_')
        {
            token_buffer_.push_back(current_);
            current_ = Next();
        }

        int token = 0;
        if (!IsKeyWord(token_buffer_, &token))
            token = Token_Id;
        RETURN_TOKEN_DETAIL(detail, token_buffer_, token);
    }